

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkparser.cpp
# Opt level: O0

void __thiscall
LinkParser::parseStatus
          (LinkParser *this,Link *link,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *tokenList)

{
  bool bVar1;
  size_type sVar2;
  string *psVar3;
  InputError *this_00;
  string local_b0 [39];
  allocator local_89;
  string local_88 [55];
  allocator local_51;
  string local_50 [32];
  double local_30;
  double setting;
  string *tokens;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *tokenList_local;
  Link *link_local;
  LinkParser *this_local;
  
  tokens = (string *)tokenList;
  tokenList_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)link;
  link_local = (Link *)this;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(tokenList);
  if (1 < sVar2) {
    setting = (double)std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    *)tokens,0);
    psVar3 = (string *)((long)setting + 0x20);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_50,"OPEN",&local_51);
    bVar1 = Utilities::match(psVar3,(string *)local_50);
    std::__cxx11::string::~string(local_50);
    std::allocator<char>::~allocator((allocator<char> *)&local_51);
    if (bVar1) {
      (**(code **)((tokenList_local->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + 0x50))(tokenList_local,1);
    }
    else {
      psVar3 = (string *)((long)setting + 0x20);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_88,"CLOSED",&local_89);
      bVar1 = Utilities::match(psVar3,(string *)local_88);
      std::__cxx11::string::~string(local_88);
      std::allocator<char>::~allocator((allocator<char> *)&local_89);
      if (bVar1) {
        (**(code **)((tokenList_local->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 0x50))(tokenList_local,0);
      }
      else {
        bVar1 = Utilities::parseNumber<double>((string *)((long)setting + 0x20),&local_30);
        if (!bVar1) {
          this_00 = (InputError *)__cxa_allocate_exception(0x30);
          std::__cxx11::string::string(local_b0,(string *)((long)setting + 0x20));
          InputError::InputError(this_00,3,(string *)local_b0);
          __cxa_throw(this_00,&InputError::typeinfo,InputError::~InputError);
        }
        (**(code **)((tokenList_local->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_start + 0x58))(local_30);
      }
    }
  }
  return;
}

Assistant:

void LinkParser::parseStatus(Link* link, vector<string>& tokenList)
{
    // Contents of tokenList are:
    // 0 - link ID
    // 1 - OPEN/CLOSED keyword or numerical setting

    if ( tokenList.size() < 2 ) return;
    string* tokens = &tokenList[0];
    double setting;

    // ... check for OPEN/CLOSED keywords

    if (Utilities::match(tokens[1], "OPEN"))
    {
	    link->setInitStatus(Link::LINK_OPEN);
    }
    else if (Utilities::match(tokens[1], "CLOSED"))
    {
	    link->setInitStatus(Link::LINK_CLOSED);
    }

    // ... check for numerical setting value

    else if (Utilities::parseNumber(tokens[1], setting))
    {
	    link->setInitSetting(setting);
    }
    else throw InputError(InputError::INVALID_KEYWORD, tokens[1]);
}